

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O1

OldToNew __thiscall
wasm::Debug::LocationUpdater::getCompileUnitBasesForLoc(LocationUpdater *this,size_t offset)

{
  _Hash_node_base *p_Var1;
  undefined8 in_RAX;
  size_type sVar2;
  mapped_type *pmVar3;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  key_type local_28;
  key_type local_24;
  
  _local_28 = CONCAT44((key_type)((ulong)in_RAX >> 0x20),(int)offset);
  sVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(&(this->locToUnitMap)._M_h,&local_28);
  if (sVar2 != 0) {
    _local_28 = CONCAT44((int)offset,local_28);
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->locToUnitMap,&local_24);
    p_Var4 = (_Hash_node_base *)*pmVar3;
    uVar5 = (this->compileUnitBases)._M_h._M_bucket_count;
    uVar6 = (ulong)p_Var4 % uVar5;
    p_Var7 = (this->compileUnitBases)._M_h._M_buckets[uVar6];
    p_Var8 = (__node_base_ptr)0x0;
    if ((p_Var7 != (__node_base_ptr)0x0) &&
       (p_Var1 = p_Var7->_M_nxt, p_Var8 = p_Var7, p_Var4 != p_Var7->_M_nxt[1]._M_nxt)) {
      while (p_Var7 = p_Var1, p_Var1 = p_Var7->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
        p_Var8 = (__node_base_ptr)0x0;
        if (((ulong)p_Var1[1]._M_nxt % uVar5 != uVar6) ||
           (p_Var8 = p_Var7, p_Var4 == p_Var1[1]._M_nxt)) goto LAB_009935d3;
      }
      p_Var8 = (__node_base_ptr)0x0;
    }
LAB_009935d3:
    if (p_Var8 == (__node_base_ptr)0x0) {
      p_Var4 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var4 = p_Var8->_M_nxt;
    }
    if (p_Var4 != (_Hash_node_base *)0x0) {
      uVar6 = (ulong)p_Var4[2]._M_nxt & 0xffffffff00000000;
      uVar5 = (ulong)p_Var4[2]._M_nxt & 0xffffffff;
      goto LAB_009935fd;
    }
  }
  uVar5 = 0;
  uVar6 = 0;
LAB_009935fd:
  return (OldToNew)(uVar5 | uVar6);
}

Assistant:

OldToNew getCompileUnitBasesForLoc(size_t offset) const {
    if (locToUnitMap.count(offset) == 0) {
      // There is no compile unit for this loc. It doesn't matter what we set
      // here.
      return OldToNew{0, 0};
    }
    auto index = locToUnitMap.at(offset);
    auto iter = compileUnitBases.find(index);
    if (iter != compileUnitBases.end()) {
      return iter->second;
    }
    return OldToNew{0, 0};
  }